

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettingsTestCase.cpp
# Opt level: O0

void __thiscall SuiteSessionSettingsTests::TeststripSpaces::RunImpl(TeststripSpaces *this)

{
  TestResults *pTVar1;
  string *beginString;
  string *senderCompID;
  string *targetCompID;
  TestResults **ppTVar2;
  Dictionary *pDVar3;
  TestDetails **ppTVar4;
  string *psVar5;
  TestDetails local_e00;
  allocator<char> local_dd9;
  string local_dd8 [32];
  double local_db8;
  double local_db0 [5];
  TestDetails local_d88;
  allocator<char> local_d61;
  string local_d60 [32];
  double local_d40;
  double local_d38 [5];
  TestDetails local_d10;
  allocator<char> local_ce9;
  string local_ce8 [32];
  double local_cc8;
  double local_cc0 [5];
  TestDetails local_c98;
  allocator<char> local_c71;
  string local_c70 [32];
  double local_c50;
  double local_c48 [5];
  TestDetails local_c20;
  allocator<char> local_bf9;
  string local_bf8 [32];
  double local_bd8;
  double local_bd0 [5];
  TestDetails local_ba8;
  allocator<char> local_b81;
  string local_b80 [32];
  double local_b60;
  double local_b58 [5];
  TestDetails local_b30;
  allocator<char> local_b09;
  string local_b08 [32];
  int local_ae8 [10];
  TestDetails local_ac0;
  allocator<char> local_a99;
  string local_a98 [32];
  int local_a78 [10];
  TestDetails local_a50;
  allocator<char> local_a29;
  string local_a28 [32];
  int local_a08 [10];
  TestDetails local_9e0;
  allocator<char> local_9b9;
  string local_9b8 [32];
  int local_998 [10];
  TestDetails local_970;
  allocator<char> local_949;
  string local_948 [32];
  int local_928 [10];
  TestDetails local_900;
  allocator<char> local_8d9;
  string local_8d8 [32];
  int local_8b8 [10];
  TestDetails local_890;
  allocator<char> local_869;
  string local_868 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848 [2];
  TestDetails local_808;
  allocator<char> local_7e1;
  string local_7e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0 [2];
  TestDetails local_780;
  allocator<char> local_759;
  string local_758 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_738 [2];
  TestDetails local_6f8;
  allocator<char> local_6d1;
  string local_6d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0 [2];
  TestDetails local_670;
  allocator<char> local_649;
  string local_648 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628 [2];
  TestDetails local_5e8;
  allocator<char> local_5c1;
  string local_5c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  allocator<char> local_579;
  string local_578;
  allocator<char> local_551;
  STRING local_550;
  StringField local_530;
  allocator<char> local_4c9;
  STRING local_4c8;
  StringField local_4a8;
  allocator<char> local_441;
  STRING local_440;
  StringField local_420;
  undefined1 local_3c0 [8];
  SessionID session1;
  istringstream input;
  allocator<char> local_c1;
  string local_c0 [8];
  string configuration;
  SessionSettings object;
  TeststripSpaces *this_local;
  
  FIX::SessionSettings::SessionSettings((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,
             " [ DEFAULT ] \nStringValue1=StringValue1\nStringValue2=StringValue2 \nStringValue3= StringValue3\nStringValue4 =StringValue4\n StringValue5=StringValue5\n  StringValue6  =  StringValue6  \nIntegerValue1=1\nIntegerValue2=2 \nIntegerValue3= 3\nIntegerValue4 =4\n IntegerValue5=5\n  IntegerValue6  =  6  \n  [  SESSION  ]  \nConnectionType=initiator\nBeginString=FIX.4.0\nSenderCompID=ISLD\nTargetCompID=TW\nDoubleValue1=1.1\nDoubleValue2=2.2 \nDoubleValue3= 3.3\nDoubleValue4 =4.4\n DoubleValue5=5.5\n  DoubleValue6  =  6.6  \n"
             ,&local_c1);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(session1.m_frozenString.field_2._M_local_buf + 8),local_c0,_S_in);
  FIX::operator>>((istream *)(session1.m_frozenString.field_2._M_local_buf + 8),
                  (SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"FIX.4.0",&local_441);
  FIX::BeginString::BeginString((BeginString *)&local_420,&local_440);
  beginString = FIX::StringField::operator_cast_to_string_(&local_420);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"ISLD",&local_4c9);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_4a8,&local_4c8);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_550,"TW",&local_551);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_530,&local_550);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_530);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"",&local_579);
  FIX::SessionID::SessionID((SessionID *)local_3c0,beginString,senderCompID,targetCompID,&local_578)
  ;
  std::__cxx11::string::~string((string *)&local_578);
  std::allocator<char>::~allocator(&local_579);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator(&local_551);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator(&local_4c9);
  FIX::BeginString::~BeginString((BeginString *)&local_420);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"StringValue1",&local_5c1);
  FIX::Dictionary::getString((string *)&local_5a0,SUB81(pDVar3,0));
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_5e8,*ppTVar4,0x118);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue1",&local_5a0,&local_5e8);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string(local_5c0);
  std::allocator<char>::~allocator(&local_5c1);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_648,"StringValue2",&local_649);
  FIX::Dictionary::getString((string *)local_628,SUB81(pDVar3,0));
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_670,*ppTVar4,0x119);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue2",local_628,&local_670);
  std::__cxx11::string::~string((string *)local_628);
  std::__cxx11::string::~string(local_648);
  std::allocator<char>::~allocator(&local_649);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6d0,"StringValue3",&local_6d1);
  FIX::Dictionary::getString((string *)local_6b0,SUB81(pDVar3,0));
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_6f8,*ppTVar4,0x11a);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue3",local_6b0,&local_6f8);
  std::__cxx11::string::~string((string *)local_6b0);
  std::__cxx11::string::~string(local_6d0);
  std::allocator<char>::~allocator(&local_6d1);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_758,"StringValue4",&local_759);
  FIX::Dictionary::getString((string *)local_738,SUB81(pDVar3,0));
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_780,*ppTVar4,0x11b);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue4",local_738,&local_780);
  std::__cxx11::string::~string((string *)local_738);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator(&local_759);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"StringValue5",&local_7e1);
  FIX::Dictionary::getString((string *)local_7c0,SUB81(pDVar3,0));
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_808,*ppTVar4,0x11c);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue5",local_7c0,&local_808);
  std::__cxx11::string::~string((string *)local_7c0);
  std::__cxx11::string::~string(local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_868,"StringValue6",&local_869);
  FIX::Dictionary::getString((string *)local_848,SUB81(pDVar3,0));
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_890,*ppTVar4,0x11d);
  UnitTest::CheckEqual<char[13],std::__cxx11::string>
            (pTVar1,(char (*) [13])"StringValue6",local_848,&local_890);
  std::__cxx11::string::~string((string *)local_848);
  std::__cxx11::string::~string(local_868);
  std::allocator<char>::~allocator(&local_869);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8b8[1] = 1;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8d8,"IntegerValue1",&local_8d9);
  local_8b8[0] = FIX::Dictionary::getInt((string *)pDVar3);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_900,*ppTVar4,0x11f);
  UnitTest::CheckEqual<int,int>(pTVar1,local_8b8 + 1,local_8b8,&local_900);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator(&local_8d9);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_928[1] = 2;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_948,"IntegerValue2",&local_949);
  local_928[0] = FIX::Dictionary::getInt((string *)pDVar3);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_970,*ppTVar4,0x120);
  UnitTest::CheckEqual<int,int>(pTVar1,local_928 + 1,local_928,&local_970);
  std::__cxx11::string::~string(local_948);
  std::allocator<char>::~allocator(&local_949);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_998[1] = 3;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9b8,"IntegerValue3",&local_9b9);
  local_998[0] = FIX::Dictionary::getInt((string *)pDVar3);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_9e0,*ppTVar4,0x121);
  UnitTest::CheckEqual<int,int>(pTVar1,local_998 + 1,local_998,&local_9e0);
  std::__cxx11::string::~string(local_9b8);
  std::allocator<char>::~allocator(&local_9b9);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_a08[1] = 4;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a28,"IntegerValue4",&local_a29);
  local_a08[0] = FIX::Dictionary::getInt((string *)pDVar3);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_a50,*ppTVar4,0x122);
  UnitTest::CheckEqual<int,int>(pTVar1,local_a08 + 1,local_a08,&local_a50);
  std::__cxx11::string::~string(local_a28);
  std::allocator<char>::~allocator(&local_a29);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_a78[1] = 5;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a98,"IntegerValue5",&local_a99);
  local_a78[0] = FIX::Dictionary::getInt((string *)pDVar3);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_ac0,*ppTVar4,0x123);
  UnitTest::CheckEqual<int,int>(pTVar1,local_a78 + 1,local_a78,&local_ac0);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator(&local_a99);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_ae8[1] = 6;
  pDVar3 = FIX::SessionSettings::get((SessionSettings *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b08,"IntegerValue6",&local_b09);
  local_ae8[0] = FIX::Dictionary::getInt((string *)pDVar3);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_b30,*ppTVar4,0x124);
  UnitTest::CheckEqual<int,int>(pTVar1,local_ae8 + 1,local_ae8,&local_b30);
  std::__cxx11::string::~string(local_b08);
  std::allocator<char>::~allocator(&local_b09);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_b58[0] = 1.1;
  psVar5 = (string *)FIX::SessionSettings::get((SessionID *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b80,"DoubleValue1",&local_b81);
  local_b60 = (double)FIX::Dictionary::getDouble(psVar5);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_ba8,*ppTVar4,0x126);
  UnitTest::CheckEqual<double,double>(pTVar1,local_b58,&local_b60,&local_ba8);
  std::__cxx11::string::~string(local_b80);
  std::allocator<char>::~allocator(&local_b81);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_bd0[0] = 2.2;
  psVar5 = (string *)FIX::SessionSettings::get((SessionID *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_bf8,"DoubleValue2",&local_bf9);
  local_bd8 = (double)FIX::Dictionary::getDouble(psVar5);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_c20,*ppTVar4,0x127);
  UnitTest::CheckEqual<double,double>(pTVar1,local_bd0,&local_bd8,&local_c20);
  std::__cxx11::string::~string(local_bf8);
  std::allocator<char>::~allocator(&local_bf9);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_c48[0] = 3.3;
  psVar5 = (string *)FIX::SessionSettings::get((SessionID *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c70,"DoubleValue3",&local_c71);
  local_c50 = (double)FIX::Dictionary::getDouble(psVar5);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_c98,*ppTVar4,0x128);
  UnitTest::CheckEqual<double,double>(pTVar1,local_c48,&local_c50,&local_c98);
  std::__cxx11::string::~string(local_c70);
  std::allocator<char>::~allocator(&local_c71);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_cc0[0] = 4.4;
  psVar5 = (string *)FIX::SessionSettings::get((SessionID *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_ce8,"DoubleValue4",&local_ce9);
  local_cc8 = (double)FIX::Dictionary::getDouble(psVar5);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_d10,*ppTVar4,0x129);
  UnitTest::CheckEqual<double,double>(pTVar1,local_cc0,&local_cc8,&local_d10);
  std::__cxx11::string::~string(local_ce8);
  std::allocator<char>::~allocator(&local_ce9);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_d38[0] = 5.5;
  psVar5 = (string *)FIX::SessionSettings::get((SessionID *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d60,"DoubleValue5",&local_d61);
  local_d40 = (double)FIX::Dictionary::getDouble(psVar5);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_d88,*ppTVar4,0x12a);
  UnitTest::CheckEqual<double,double>(pTVar1,local_d38,&local_d40,&local_d88);
  std::__cxx11::string::~string(local_d60);
  std::allocator<char>::~allocator(&local_d61);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_db0[0] = 6.6;
  psVar5 = (string *)FIX::SessionSettings::get((SessionID *)((long)&configuration.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_dd8,"DoubleValue6",&local_dd9);
  local_db8 = (double)FIX::Dictionary::getDouble(psVar5);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_e00,*ppTVar4,299);
  UnitTest::CheckEqual<double,double>(pTVar1,local_db0,&local_db8,&local_e00);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator(&local_dd9);
  FIX::SessionID::~SessionID((SessionID *)local_3c0);
  std::__cxx11::istringstream::~istringstream
            ((istringstream *)(session1.m_frozenString.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_c0);
  FIX::SessionSettings::~SessionSettings((SessionSettings *)((long)&configuration.field_2 + 8));
  return;
}

Assistant:

TEST(stripSpaces)
{
  SessionSettings object;
  std::string configuration =
    " [ DEFAULT ] \n"
    "StringValue1=StringValue1\n"
    "StringValue2=StringValue2 \n"
    "StringValue3= StringValue3\n"
    "StringValue4 =StringValue4\n"
    " StringValue5=StringValue5\n"
    "  StringValue6  =  StringValue6  \n"
    "IntegerValue1=1\n"
    "IntegerValue2=2 \n"
    "IntegerValue3= 3\n"
    "IntegerValue4 =4\n"
    " IntegerValue5=5\n"
    "  IntegerValue6  =  6  \n"
    "  [  SESSION  ]  \n"
    "ConnectionType=initiator\n"
    "BeginString=FIX.4.0\n"
    "SenderCompID=ISLD\n"
    "TargetCompID=TW\n"
    "DoubleValue1=1.1\n"
    "DoubleValue2=2.2 \n"
    "DoubleValue3= 3.3\n"
    "DoubleValue4 =4.4\n"
    " DoubleValue5=5.5\n"
    "  DoubleValue6  =  6.6  \n";

  std::istringstream input( configuration );

  input >> object;

  SessionID session1( BeginString( "FIX.4.0" ),
                      SenderCompID( "ISLD" ),
                      TargetCompID( "TW" ) );

  CHECK_EQUAL( "StringValue1", object.get().getString( "StringValue1" ) );
  CHECK_EQUAL( "StringValue2", object.get().getString( "StringValue2" ) );
  CHECK_EQUAL( "StringValue3", object.get().getString( "StringValue3" ) );
  CHECK_EQUAL( "StringValue4", object.get().getString( "StringValue4" ) );
  CHECK_EQUAL( "StringValue5", object.get().getString( "StringValue5" ) );
  CHECK_EQUAL( "StringValue6", object.get().getString( "StringValue6" ) );

  CHECK_EQUAL( 1, object.get().getInt( "IntegerValue1" ) );
  CHECK_EQUAL( 2, object.get().getInt( "IntegerValue2" ) );
  CHECK_EQUAL( 3, object.get().getInt( "IntegerValue3" ) );
  CHECK_EQUAL( 4, object.get().getInt( "IntegerValue4" ) );
  CHECK_EQUAL( 5, object.get().getInt( "IntegerValue5" ) );
  CHECK_EQUAL( 6, object.get().getInt( "IntegerValue6" ) );

  CHECK_EQUAL( 1.1, object.get(session1).getDouble( "DoubleValue1" ) );
  CHECK_EQUAL( 2.2, object.get(session1).getDouble( "DoubleValue2" ) );
  CHECK_EQUAL( 3.3, object.get(session1).getDouble( "DoubleValue3" ) );
  CHECK_EQUAL( 4.4, object.get(session1).getDouble( "DoubleValue4" ) );
  CHECK_EQUAL( 5.5, object.get(session1).getDouble( "DoubleValue5" ) );
  CHECK_EQUAL( 6.6, object.get(session1).getDouble( "DoubleValue6" ) );
}